

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_cobs_zpe.c
# Opt level: O0

int mpt_decode_cobs_zpe_r(mpt_decode_state *info,iovec *source,size_t sourcelen)

{
  int iVar1;
  size_t sourcelen_local;
  iovec *source_local;
  mpt_decode_state *info_local;
  
  iVar1 = _decode_r(info,source,sourcelen);
  return iVar1;
}

Assistant:

extern int mpt_decode_cobs_zpe_r(MPT_STRUCT(decode_state) *info, const struct iovec *source, size_t sourcelen)
{
	return _decode_r(info, source, sourcelen);
}